

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_striped_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_trace_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  ulong uVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  int *piVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  uint uVar19;
  int32_t index;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  parasail_result_t *ppVar24;
  __m256i *ptr;
  __m256i *palVar25;
  __m256i *ptr_00;
  __m256i *palVar26;
  __m256i *ptr_01;
  __m256i *ptr_02;
  int32_t *ptr_03;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  __m256i *palVar31;
  __m256i *palVar32;
  uint uVar33;
  __m256i *palVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  __m256i alVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  __m256i alVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  int local_1d4;
  int local_1b8;
  __m256i *local_1b0;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_trace_striped_profile_avx2_256_32_cold_1();
        }
        else {
          uVar20 = uVar4 - 1;
          uVar44 = (ulong)uVar4 + 7 >> 3;
          uVar9 = (ulong)uVar20 % uVar44;
          iVar23 = (int)(uVar20 / uVar44);
          uVar35 = -open;
          uVar36 = ppVar7->min;
          uVar39 = 0x80000000 - uVar36;
          if (uVar36 != uVar35 && SBORROW4(uVar36,uVar35) == (int)(uVar36 + open) < 0) {
            uVar39 = open | 0x80000000;
          }
          iVar21 = 0x7ffffffe - ppVar7->max;
          uVar36 = (uint)uVar44;
          ppVar24 = parasail_result_new_trace(uVar36,s2Len,0x20,0x20);
          if (ppVar24 != (parasail_result_t *)0x0) {
            ppVar24->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar24->flag | 0x8480802;
            ptr = parasail_memalign___m256i(0x20,uVar44);
            palVar25 = parasail_memalign___m256i(0x20,uVar44);
            ptr_00 = parasail_memalign___m256i(0x20,uVar44);
            palVar26 = parasail_memalign___m256i(0x20,uVar44);
            ptr_01 = parasail_memalign___m256i(0x20,uVar44);
            ptr_02 = parasail_memalign___m256i(0x20,uVar44);
            ptr_03 = parasail_memalign_int32_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_03 != (int32_t *)0x0 && (ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0))
                && ((palVar26 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) &&
                   (palVar25 != (__m256i *)0x0 && ptr != (__m256i *)0x0))) {
              iVar1 = s2Len + -1;
              iVar41 = 7 - iVar23;
              auVar49._4_4_ = open;
              auVar49._0_4_ = open;
              auVar49._8_4_ = open;
              auVar49._12_4_ = open;
              auVar49._16_4_ = open;
              auVar49._20_4_ = open;
              auVar49._24_4_ = open;
              auVar49._28_4_ = open;
              auVar50._4_4_ = gap;
              auVar50._0_4_ = gap;
              auVar50._8_4_ = gap;
              auVar50._12_4_ = gap;
              auVar50._16_4_ = gap;
              auVar50._20_4_ = gap;
              auVar50._24_4_ = gap;
              auVar50._28_4_ = gap;
              uVar39 = uVar39 + 1;
              auVar45._4_4_ = iVar41;
              auVar45._0_4_ = iVar41;
              auVar45._8_4_ = iVar41;
              auVar45._12_4_ = iVar41;
              auVar45._16_4_ = iVar41;
              auVar45._20_4_ = iVar41;
              auVar45._24_4_ = iVar41;
              auVar45._28_4_ = iVar41;
              auVar56._4_4_ = 0;
              auVar56._0_4_ = open;
              auVar48._4_4_ = uVar35;
              auVar48._0_4_ = uVar35;
              auVar48._8_4_ = uVar35;
              auVar48._12_4_ = uVar35;
              auVar48._16_4_ = uVar35;
              auVar48._20_4_ = uVar35;
              auVar48._24_4_ = uVar35;
              auVar48._28_4_ = uVar35;
              auVar54._8_8_ = uVar44;
              auVar54._0_8_ = uVar44;
              auVar54._16_8_ = uVar44;
              auVar54._24_8_ = uVar44;
              auVar51 = vpmuldq_avx2(auVar54,_DAT_00908c60);
              auVar68 = vpmuldq_avx2(auVar54,_DAT_00908b60);
              auVar56._8_4_ = open;
              auVar56._12_4_ = 0;
              auVar56._16_4_ = open;
              auVar56._20_4_ = 0;
              auVar56._24_4_ = open;
              auVar56._28_4_ = 0;
              uVar27 = 0;
              auVar54 = vpmovsxbd_avx2(ZEXT816(0x706060406040200));
              auVar46._8_8_ = 0xffffffff80000000;
              auVar46._0_8_ = 0xffffffff80000000;
              auVar46._16_8_ = 0xffffffff80000000;
              auVar46._24_8_ = 0xffffffff80000000;
              palVar31 = ptr;
              palVar32 = ptr_00;
              palVar34 = palVar26;
              do {
                if (s1_beg == 0) {
                  auVar70._8_8_ = uVar27;
                  auVar70._0_8_ = uVar27;
                  auVar70._16_8_ = uVar27;
                  auVar70._24_8_ = uVar27;
                  auVar58 = vpaddq_avx2(auVar70,auVar51);
                  auVar70 = vpaddq_avx2(auVar70,auVar68);
                  auVar70 = vpermd_avx2(auVar54,auVar70);
                  auVar58 = vpermd_avx2(auVar54,auVar58);
                  auVar63._0_16_ = ZEXT116(0) * auVar58._0_16_ + ZEXT116(1) * auVar70._0_16_;
                  auVar63._16_16_ = ZEXT116(0) * auVar70._16_16_ + ZEXT116(1) * auVar58._0_16_;
                  auVar58 = vpmulld_avx2(auVar50,auVar63);
                  alVar62 = (__m256i)vpsubd_avx2(auVar48,auVar58);
                }
                else {
                  alVar62 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar58 = vpmovsxdq_avx2(alVar62._16_16_);
                auVar70 = vpmovsxdq_avx2(alVar62._0_16_);
                auVar63 = vpsubq_avx2(auVar58,auVar56);
                auVar58 = vpcmpgtq_avx2(auVar63,auVar46);
                auVar58 = vblendvpd_avx(auVar46,auVar63,auVar58);
                auVar63 = vpsubq_avx2(auVar70,auVar56);
                auVar70 = vpcmpgtq_avx2(auVar63,auVar46);
                auVar70 = vblendvpd_avx(auVar46,auVar63,auVar70);
                auVar70 = vpermd_avx2(auVar54,auVar70);
                auVar58 = vpermd_avx2(auVar54,auVar58);
                alVar67._0_16_ = ZEXT116(0) * auVar58._0_16_ + ZEXT116(1) * auVar70._0_16_;
                alVar67._16_16_ = ZEXT116(0) * auVar70._16_16_ + ZEXT116(1) * auVar58._0_16_;
                *palVar31 = alVar62;
                *palVar32 = alVar67;
                *palVar34 = alVar67;
                uVar27 = uVar27 + 1;
                palVar34 = palVar34 + 1;
                palVar32 = palVar32 + 1;
                palVar31 = palVar31 + 1;
              } while (uVar44 != uVar27);
              *ptr_03 = 0;
              uVar38 = (ulong)(uint)s2Len;
              lVar28 = uVar38 - 1;
              auVar60._8_8_ = lVar28;
              auVar60._0_8_ = lVar28;
              auVar60._16_8_ = lVar28;
              auVar60._24_8_ = lVar28;
              auVar54 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar27 = 0;
              auVar68 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar56 = vpmovsxbq_avx2(ZEXT416(0x7060504));
              auVar58._8_8_ = 0x8000000000000000;
              auVar58._0_8_ = 0x8000000000000000;
              auVar58._16_8_ = 0x8000000000000000;
              auVar58._24_8_ = 0x8000000000000000;
              auVar51 = vpcmpeqd_avx2((undefined1  [32])alVar62,(undefined1  [32])alVar62);
              do {
                if (s2_beg == 0) {
                  auVar46 = vpaddd_avx2(auVar51,auVar54);
                  auVar46 = vpmulld_avx2(auVar46,auVar50);
                  auVar46 = vpsubd_avx2(auVar48,auVar46);
                }
                else {
                  auVar46 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar69._8_8_ = uVar27;
                auVar69._0_8_ = uVar27;
                auVar69._16_8_ = uVar27;
                auVar69._24_8_ = uVar27;
                auVar63 = vpor_avx2(auVar69,auVar68);
                auVar70 = vpor_avx2(auVar69,auVar56);
                auVar70 = vpcmpgtq_avx2(auVar70 ^ auVar58,auVar60 ^ auVar58);
                auVar63 = vpcmpgtq_avx2(auVar63 ^ auVar58,auVar60 ^ auVar58);
                auVar70 = vpackssdw_avx2(auVar63,auVar70);
                auVar10 = vpackssdw_avx(SUB3216(auVar70 ^ auVar51,0),SUB3216(auVar70 ^ auVar51,0x10)
                                       );
                auVar10 = vpshufd_avx(auVar10,0xd8);
                auVar70 = vpmovzxwd_avx2(auVar10);
                auVar70 = vpslld_avx2(auVar70,0x1f);
                auVar46 = vpmaskmovd_avx2(auVar70,auVar46);
                *(undefined1 (*) [32])(ptr_03 + uVar27 + 1) = auVar46;
                uVar27 = uVar27 + 8;
                auVar11._8_4_ = 8;
                auVar11._0_8_ = 0x800000008;
                auVar11._12_4_ = 8;
                auVar11._16_4_ = 8;
                auVar11._20_4_ = 8;
                auVar11._24_4_ = 8;
                auVar11._28_4_ = 8;
                auVar54 = vpaddd_avx2(auVar54,auVar11);
              } while ((s2Len + 7U & 0xfffffff8) != uVar27);
              lVar40 = uVar44 * 0x20;
              lVar28 = 0;
              do {
                puVar3 = (undefined8 *)((long)((ppVar24->field_4).rowcols)->score_row + lVar28);
                *puVar3 = 0x800000008;
                puVar3[1] = 0x800000008;
                puVar3[2] = 0x800000008;
                puVar3[3] = 0x800000008;
                lVar28 = lVar28 + 0x20;
              } while (lVar40 != lVar28);
              lVar43 = 0;
              auVar68._8_4_ = 2;
              auVar68._0_8_ = 0x200000002;
              auVar68._12_4_ = 2;
              auVar68._16_4_ = 2;
              auVar68._20_4_ = 2;
              auVar68._24_4_ = 2;
              auVar68._28_4_ = 2;
              auVar71._8_4_ = 4;
              auVar71._0_8_ = 0x400000004;
              auVar71._12_4_ = 4;
              auVar71._16_4_ = 4;
              auVar71._20_4_ = 4;
              auVar71._24_4_ = 4;
              auVar71._28_4_ = 4;
              auVar73._8_4_ = 0x20;
              auVar73._0_8_ = 0x2000000020;
              auVar73._12_4_ = 0x20;
              auVar73._16_4_ = 0x20;
              auVar73._20_4_ = 0x20;
              auVar73._24_4_ = 0x20;
              auVar73._28_4_ = 0x20;
              auVar74._8_4_ = 0x40;
              auVar74._0_8_ = 0x4000000040;
              auVar74._12_4_ = 0x40;
              auVar74._16_4_ = 0x40;
              auVar74._20_4_ = 0x40;
              auVar74._24_4_ = 0x40;
              auVar74._28_4_ = 0x40;
              auVar54 = vpcmpeqd_avx2(auVar45,_DAT_00908d20);
              auVar57 = ZEXT3264(CONCAT428(iVar21,CONCAT424(iVar21,CONCAT420(iVar21,CONCAT416(iVar21
                                                  ,CONCAT412(iVar21,CONCAT48(iVar21,CONCAT44(iVar21,
                                                  iVar21))))))));
              auVar51._4_4_ = uVar39;
              auVar51._0_4_ = uVar39;
              auVar51._8_4_ = uVar39;
              auVar51._12_4_ = uVar39;
              auVar51._16_4_ = uVar39;
              auVar51._20_4_ = uVar39;
              auVar51._24_4_ = uVar39;
              auVar51._28_4_ = uVar39;
              auVar55 = ZEXT3264(auVar51);
              auVar52 = ZEXT3264(auVar51);
              lVar28 = lVar40;
              uVar27 = 0;
              local_1d4 = iVar1;
              do {
                local_1b0 = ptr_01;
                palVar31 = ptr;
                ptr = palVar25;
                ptr_01 = palVar26;
                auVar51 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                auVar51 = vpermd_avx2(auVar51,(undefined1  [32])palVar31[uVar36 - 1]);
                auVar51 = vpblendd_avx2(auVar51,ZEXT432((uint)ptr_03[uVar27]),1);
                lVar42 = (long)ppVar7->mapper[(byte)s2[uVar27]] * uVar44;
                uVar2 = uVar27 + 1;
                uVar29 = 1;
                lVar37 = 0;
                auVar61 = ZEXT3264(CONCAT428(uVar39,CONCAT424(uVar39,CONCAT420(uVar39,CONCAT416(
                                                  uVar39,CONCAT412(uVar39,CONCAT48(uVar39,CONCAT44(
                                                  uVar39,uVar39))))))));
                do {
                  auVar45 = *(undefined1 (*) [32])((long)*ptr_00 + lVar37);
                  auVar51 = vpaddd_avx2(auVar51,*(undefined1 (*) [32])
                                                 ((long)pvVar6 + lVar37 + lVar42 * 0x20));
                  auVar56 = vpmaxsd_avx2(auVar51,auVar45);
                  auVar58 = auVar61._0_32_;
                  auVar46 = vpmaxsd_avx2(auVar56,auVar58);
                  *(undefined1 (*) [32])((long)*ptr + lVar37) = auVar46;
                  auVar48 = vpcmpeqd_avx2(auVar46,auVar51);
                  auVar51 = vpcmpgtd_avx2(auVar56,auVar58);
                  auVar51 = vpaddd_avx2(auVar68,auVar51);
                  auVar51 = vblendvps_avx(auVar51,auVar71,auVar48);
                  auVar48 = vorps_avx(auVar51,*(undefined1 (*) [32])
                                               ((long)((ppVar24->field_4).rowcols)->score_row +
                                               lVar37 + lVar43));
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar37) = auVar51;
                  *(undefined1 (*) [32])
                   ((long)((ppVar24->field_4).rowcols)->score_row + lVar37 + lVar43) = auVar48;
                  auVar48 = vpsubd_avx2(auVar46,auVar49);
                  auVar53 = ZEXT3264(auVar48);
                  auVar51 = vpsubd_avx2(auVar45,auVar50);
                  auVar51 = vpmaxsd_avx2(auVar48,auVar51);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar37) = auVar51;
                  auVar56 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr_01 + lVar37),auVar50);
                  auVar51 = vpmaxsd_avx2(auVar48,auVar56);
                  *(undefined1 (*) [32])((long)*local_1b0 + lVar37) = auVar51;
                  if (uVar2 < uVar38) {
                    auVar51 = vpcmpgtd_avx2(auVar48,auVar56);
                    auVar64._8_4_ = 0x10;
                    auVar64._0_8_ = 0x1000000010;
                    auVar64._12_4_ = 0x10;
                    auVar64._16_4_ = 0x10;
                    auVar64._20_4_ = 0x10;
                    auVar64._24_4_ = 0x10;
                    auVar64._28_4_ = 0x10;
                    auVar12._8_4_ = 8;
                    auVar12._0_8_ = 0x800000008;
                    auVar12._12_4_ = 8;
                    auVar12._16_4_ = 8;
                    auVar12._20_4_ = 8;
                    auVar12._24_4_ = 8;
                    auVar12._28_4_ = 8;
                    auVar51 = vblendvps_avx(auVar64,auVar12,auVar51);
                    *(undefined1 (*) [32])
                     ((long)((ppVar24->field_4).rowcols)->score_row + lVar37 + lVar28) = auVar51;
                  }
                  auVar51 = vpsubd_avx2(auVar58,auVar50);
                  auVar66 = ZEXT3264(auVar51);
                  if (uVar29 < uVar44) {
                    piVar8 = ((ppVar24->field_4).rowcols)->score_row;
                    auVar56 = vpcmpgtd_avx2(auVar48,auVar51);
                    auVar56 = vblendvps_avx(auVar74,auVar73,auVar56);
                    auVar56 = vorps_avx(auVar56,*(undefined1 (*) [32])
                                                 ((long)piVar8 + lVar37 + 0x20 + lVar43));
                    *(undefined1 (*) [32])((long)piVar8 + lVar37 + 0x20 + lVar43) = auVar56;
                  }
                  auVar56 = vpmaxsd_avx2(auVar55._0_32_,auVar46);
                  auVar55 = ZEXT3264(auVar56);
                  auVar45 = vpminsd_avx2(auVar57._0_32_,auVar45);
                  auVar45 = vpminsd_avx2(auVar45,auVar58);
                  auVar45 = vpminsd_avx2(auVar45,auVar46);
                  auVar57 = ZEXT3264(auVar45);
                  auVar45 = vpmaxsd_avx2(auVar48,auVar51);
                  auVar61 = ZEXT3264(auVar45);
                  auVar51 = *(undefined1 (*) [32])((long)*palVar31 + lVar37);
                  lVar37 = lVar37 + 0x20;
                  uVar29 = uVar29 + 1;
                } while (lVar40 != lVar37);
                iVar22 = 0;
                auVar47 = ZEXT3264(auVar45);
                do {
                  uVar30 = uVar35;
                  if (s2_beg == 0) {
                    uVar30 = ptr_03[uVar27 + 1] - open;
                  }
                  auVar48 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                  auVar51 = vpermd_avx2(auVar48,(undefined1  [32])palVar31[uVar36 - 1]);
                  auVar51 = vpblendd_avx2(auVar51,ZEXT432((uint)ptr_03[uVar27]),1);
                  auVar59._0_16_ = ZEXT116(0) * auVar53._0_16_ + ZEXT116(1) * auVar47._0_16_;
                  auVar59._16_16_ = ZEXT116(0) * auVar47._16_16_ + ZEXT116(1) * auVar53._0_16_;
                  auVar45 = vpalignr_avx2(auVar53._0_32_,auVar59,0xc);
                  auVar45 = vpblendd_avx2(auVar45,ZEXT432(uVar30),1);
                  auVar53 = ZEXT3264(auVar45);
                  auVar45 = vpermd_avx2(auVar48,auVar47._0_32_);
                  auVar45 = vpblendd_avx2(auVar45,ZEXT432(uVar30),1);
                  auVar47 = ZEXT3264(auVar45);
                  auVar72._0_16_ = ZEXT116(0) * auVar66._0_16_ + ZEXT116(1) * auVar45._0_16_;
                  auVar72._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar66._0_16_;
                  auVar45 = vpalignr_avx2(auVar66._0_32_,auVar72,0xc);
                  auVar45 = vpblendd_avx2(auVar45,ZEXT432(uVar39),1);
                  auVar66 = ZEXT3264(auVar45);
                  auVar45 = vpermd_avx2(auVar48,auVar61._0_32_);
                  auVar45 = vpblendd_avx2(auVar45,ZEXT432(uVar30),1);
                  auVar61 = ZEXT3264(auVar45);
                  lVar37 = 0;
                  auVar17._8_8_ = 0x7800000078;
                  auVar17._0_8_ = 0x7800000078;
                  auVar17._16_8_ = 0x7800000078;
                  auVar17._24_8_ = 0x7800000078;
                  do {
                    auVar45 = *(undefined1 (*) [32])((long)*ptr + lVar37);
                    auVar46 = auVar47._0_32_;
                    auVar48 = vpmaxsd_avx2(auVar45,auVar46);
                    *(undefined1 (*) [32])((long)*ptr + lVar37) = auVar48;
                    auVar51 = vpaddd_avx2(auVar51,*(undefined1 (*) [32])
                                                   ((long)pvVar6 + lVar37 + lVar42 * 0x20));
                    auVar51 = vpcmpeqd_avx2(auVar48,auVar51);
                    auVar45 = vpcmpgtd_avx2(auVar45,auVar46);
                    auVar51 = vpor_avx2(auVar45,auVar51);
                    auVar45 = vblendvps_avx(auVar68,*(undefined1 (*) [32])((long)*ptr_02 + lVar37),
                                            auVar51);
                    auVar51 = vandps_avx(auVar17,*(undefined1 (*) [32])
                                                  ((long)((ppVar24->field_4).rowcols)->score_row +
                                                  lVar37 + lVar43));
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar37) = auVar45;
                    auVar51 = vorps_avx(auVar51,auVar45);
                    *(undefined1 (*) [32])
                     ((long)((ppVar24->field_4).rowcols)->score_row + lVar37 + lVar43) = auVar51;
                    auVar51 = vpcmpgtd_avx2(auVar53._0_32_,auVar66._0_32_);
                    piVar8 = ((ppVar24->field_4).rowcols)->score_row;
                    auVar45 = vblendvps_avx(auVar74,auVar73,auVar51);
                    auVar15._8_8_ = 0x1f0000001f;
                    auVar15._0_8_ = 0x1f0000001f;
                    auVar15._16_8_ = 0x1f0000001f;
                    auVar15._24_8_ = 0x1f0000001f;
                    auVar51 = vandps_avx(auVar15,*(undefined1 (*) [32])
                                                  ((long)piVar8 + lVar37 + lVar43));
                    auVar51 = vorps_avx(auVar51,auVar45);
                    *(undefined1 (*) [32])((long)piVar8 + lVar37 + lVar43) = auVar51;
                    auVar45 = vpsubd_avx2(auVar48,auVar49);
                    auVar53 = ZEXT3264(auVar45);
                    auVar56 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr_01 + lVar37),auVar50);
                    auVar51 = vpmaxsd_avx2(auVar45,auVar56);
                    *(undefined1 (*) [32])((long)*local_1b0 + lVar37) = auVar51;
                    if (uVar2 < uVar38) {
                      auVar51 = vpcmpgtd_avx2(auVar45,auVar56);
                      auVar65._8_4_ = 0x10;
                      auVar65._0_8_ = 0x1000000010;
                      auVar65._12_4_ = 0x10;
                      auVar65._16_4_ = 0x10;
                      auVar65._20_4_ = 0x10;
                      auVar65._24_4_ = 0x10;
                      auVar65._28_4_ = 0x10;
                      auVar13._8_4_ = 8;
                      auVar13._0_8_ = 0x800000008;
                      auVar13._12_4_ = 8;
                      auVar13._16_4_ = 8;
                      auVar13._20_4_ = 8;
                      auVar13._24_4_ = 8;
                      auVar13._28_4_ = 8;
                      auVar51 = vblendvps_avx(auVar65,auVar13,auVar51);
                      *(undefined1 (*) [32])
                       ((long)((ppVar24->field_4).rowcols)->score_row + lVar37 + lVar28) = auVar51;
                    }
                    auVar56 = vpminsd_avx2(auVar57._0_32_,auVar48);
                    auVar57 = ZEXT3264(auVar56);
                    auVar48 = vpmaxsd_avx2(auVar55._0_32_,auVar48);
                    auVar55 = ZEXT3264(auVar48);
                    auVar51 = vpsubd_avx2(auVar46,auVar50);
                    auVar47 = ZEXT3264(auVar51);
                    auVar51 = vpcmpgtd_avx2(auVar45,auVar51);
                    auVar51 = _DAT_00909280 & ~auVar51;
                    if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar51 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar51 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar51 >> 0x7f,0) == '\0') &&
                          (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar51 >> 0xbf,0) == '\0') &&
                        (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar51[0x1f]) goto LAB_00875b3b;
                    auVar51 = vpsubd_avx2(auVar61._0_32_,auVar50);
                    auVar66 = ZEXT3264(auVar51);
                    auVar51 = vpmaxsd_avx2(auVar45,auVar51);
                    auVar61 = ZEXT3264(auVar51);
                    auVar51 = *(undefined1 (*) [32])((long)*palVar31 + lVar37);
                    lVar37 = lVar37 + 0x20;
                  } while (lVar40 != lVar37);
                  iVar22 = iVar22 + 1;
                } while (iVar22 != 8);
LAB_00875b3b:
                auVar51 = vpcmpgtd_avx2((undefined1  [32])ptr[uVar9],auVar52._0_32_);
                auVar51 = auVar54 & auVar51;
                local_1b8 = (int)uVar27;
                if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar51 >> 0x7f,0) != '\0') ||
                      (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar51 >> 0xbf,0) != '\0') ||
                    (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar51[0x1f] < '\0') {
                  local_1d4 = local_1b8;
                }
                auVar51 = vpmaxsd_avx2((undefined1  [32])ptr[uVar9],auVar52._0_32_);
                auVar52 = ZEXT3264(auVar51);
                lVar28 = lVar28 + lVar40;
                lVar43 = lVar43 + lVar40;
                palVar26 = local_1b0;
                uVar27 = uVar2;
                palVar25 = palVar31;
                if (uVar2 == uVar38) {
                  uVar35 = uVar39;
                  if ((s2_end != 0) && (uVar35 = auVar51._28_4_, iVar23 < 7)) {
                    iVar22 = 0;
                    do {
                      auVar51 = auVar52._0_32_;
                      auVar54 = vperm2i128_avx2(auVar51,auVar51,0x28);
                      auVar54 = vpalignr_avx2(auVar51,auVar54,0xc);
                      uVar35 = auVar54._28_4_;
                      auVar52 = ZEXT3264(auVar54);
                      iVar22 = iVar22 + 1;
                    } while (iVar22 < iVar41);
                  }
                  uVar30 = uVar20;
                  if ((s1_end != 0) && (((ulong)uVar4 + 7 & 0x7ffffff8) != 0)) {
                    uVar44 = 0;
                    do {
                      uVar33 = ((uint)uVar44 & 7) * uVar36 + ((uint)(uVar44 >> 3) & 0x1fffffff);
                      uVar18 = uVar35;
                      uVar19 = uVar30;
                      iVar22 = local_1d4;
                      if (((int)uVar33 < (int)uVar4) &&
                         (uVar5 = *(uint *)((long)*ptr + uVar44 * 4), uVar18 = uVar5,
                         uVar19 = uVar33, iVar22 = iVar1, (int)uVar5 <= (int)uVar35)) {
                        if ((int)uVar30 <= (int)uVar33) {
                          uVar33 = uVar30;
                        }
                        uVar18 = uVar35;
                        uVar19 = uVar30;
                        iVar22 = local_1d4;
                        if (local_1d4 == iVar1 && uVar5 == uVar35) {
                          uVar19 = uVar33;
                        }
                      }
                      local_1d4 = iVar22;
                      uVar30 = uVar19;
                      uVar35 = uVar18;
                      uVar44 = uVar44 + 1;
                    } while ((uVar36 & 0xfffffff) << 3 != (int)uVar44);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    alVar62 = ptr[uVar9];
                    uVar35 = alVar62[3]._4_4_;
                    uVar30 = uVar20;
                    local_1d4 = iVar1;
                    if (iVar23 < 7) {
                      iVar23 = 0;
                      do {
                        auVar54 = vperm2i128_avx2((undefined1  [32])alVar62,
                                                  (undefined1  [32])alVar62,0x28);
                        alVar62 = (__m256i)vpalignr_avx2((undefined1  [32])alVar62,auVar54,0xc);
                        uVar35 = alVar62[3]._4_4_;
                        iVar23 = iVar23 + 1;
                      } while (iVar23 < iVar41);
                    }
                  }
                  auVar14._4_4_ = uVar39;
                  auVar14._0_4_ = uVar39;
                  auVar14._8_4_ = uVar39;
                  auVar14._12_4_ = uVar39;
                  auVar14._16_4_ = uVar39;
                  auVar14._20_4_ = uVar39;
                  auVar14._24_4_ = uVar39;
                  auVar14._28_4_ = uVar39;
                  auVar54 = vpcmpgtd_avx2(auVar14,auVar56);
                  auVar16._4_4_ = iVar21;
                  auVar16._0_4_ = iVar21;
                  auVar16._8_4_ = iVar21;
                  auVar16._12_4_ = iVar21;
                  auVar16._16_4_ = iVar21;
                  auVar16._20_4_ = iVar21;
                  auVar16._24_4_ = iVar21;
                  auVar16._28_4_ = iVar21;
                  auVar51 = vpcmpgtd_avx2(auVar48,auVar16);
                  auVar54 = vpor_avx2(auVar54,auVar51);
                  if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar54 >> 0x7f,0) != '\0') ||
                        (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar54 >> 0xbf,0) != '\0') ||
                      (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar54[0x1f] < '\0') {
                    *(byte *)&ppVar24->flag = (byte)ppVar24->flag | 0x40;
                    uVar35 = 0;
                    local_1d4 = 0;
                    uVar30 = 0;
                  }
                  ppVar24->score = uVar35;
                  ppVar24->end_query = uVar30;
                  ppVar24->end_ref = local_1d4;
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(local_1b0);
                  parasail_free(ptr_00);
                  parasail_free(palVar31);
                  parasail_free(ptr);
                  return ppVar24;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEaStore = NULL;
    __m256i* restrict pvEaLoad = NULL;
    __m256i* restrict pvHT = NULL;
    int32_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTDiag;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;
    __m256i vTMask;
    __m256i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi32(_mm256_set1_epi32(position),
            _mm256_set_epi32(0,1,2,3,4,5,6,7));
    vTIns  = _mm256_set1_epi32(PARASAIL_INS);
    vTDel  = _mm256_set1_epi32(PARASAIL_DEL);
    vTDiag = _mm256_set1_epi32(PARASAIL_DIAG);
    vTDiagE= _mm256_set1_epi32(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi32(PARASAIL_INS_E);
    vTDiagF= _mm256_set1_epi32(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi32(PARASAIL_DEL_F);
    vTMask = _mm256_set1_epi32(PARASAIL_ZERO_MASK);
    vFTMask= _mm256_set1_epi32(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 32, sizeof(__m256i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    pvEaStore= parasail_memalign___m256i(32, segLen);
    pvEaLoad = parasail_memalign___m256i(32, segLen);
    pvHT     = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            _mm256_store_si256(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFa;
        __m256i vFa_ext;
        __m256i vH;
        __m256i vH_dag;
        const __m256i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi32_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi32(vH_dag, vE);
            vH = _mm256_max_epi32(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vF);

            {
                __m256i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m256i case1 = _mm256_cmpeq_epi32(vH, vH_dag);
                __m256i case2 = _mm256_cmpeq_epi32(vH, vF);
                __m256i vT = _mm256_blendv_epi8(
                        _mm256_blendv_epi8(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm256_store_si256(pvHT + i, vT);
                vT = _mm256_or_si256(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm256_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vEF_opn, vE_ext);
            _mm256_store_si256(pvE + i, vE);
            {
                __m256i vEa = _mm256_load_si256(pvEaLoad + i);
                __m256i vEa_ext = _mm256_sub_epi32(vEa, vGapE);
                vEa = _mm256_max_epi32(vEF_opn, vEa_ext);
                _mm256_store_si256(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vEa_ext);
                    __m256i vT = _mm256_blendv_epi8(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m256i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
                __m256i vT = _mm256_blendv_epi8(vTDelF, vTDiagF, cond);
                vT = _mm256_or_si256(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 4);
            vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
            vEF_opn = _mm256_slli_si256_rpl(vEF_opn, 4);
            vEF_opn = _mm256_insert_epi32_rpl(vEF_opn, tmp2, 0);
            vF_ext = _mm256_slli_si256_rpl(vF_ext, 4);
            vF_ext = _mm256_insert_epi32_rpl(vF_ext, NEG_LIMIT, 0);
            vF = _mm256_slli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, tmp2, 0);
            vFa_ext = _mm256_slli_si256_rpl(vFa_ext, 4);
            vFa_ext = _mm256_insert_epi32_rpl(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm256_slli_si256_rpl(vFa, 4);
            vFa = _mm256_insert_epi32_rpl(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
                {
                    __m256i vTAll;
                    __m256i vT;
                    __m256i case1;
                    __m256i case2;
                    __m256i cond;
                    vHp = _mm256_add_epi32(vHp, _mm256_load_si256(vP + i));
                    case1 = _mm256_cmpeq_epi32(vH, vHp);
                    case2 = _mm256_cmpeq_epi32(vH, vF);
                    cond = _mm256_andnot_si256(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm256_load_si256(pvHT + i);
                    vT = _mm256_blendv_epi8(vT, vTDel, cond);
                    _mm256_store_si256(pvHT + i, vT);
                    vTAll = _mm256_and_si256(vTAll, vTMask);
                    vTAll = _mm256_or_si256(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m256i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vFa_ext);
                    __m256i vT = _mm256_blendv_epi8(vTDelF, vTDiagF, cond);
                    vTAll = _mm256_and_si256(vTAll, vFTMask);
                    vTAll = _mm256_or_si256(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm256_sub_epi32(vH, vGapO);
                vF_ext = _mm256_sub_epi32(vF, vGapE);
                {
                    __m256i vEa = _mm256_load_si256(pvEaLoad + i);
                    __m256i vEa_ext = _mm256_sub_epi32(vEa, vGapE);
                    vEa = _mm256_max_epi32(vEF_opn, vEa_ext);
                    _mm256_store_si256(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vEa_ext);
                        __m256i vT = _mm256_blendv_epi8(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm256_sub_epi32(vFa, vGapE);
                vFa = _mm256_max_epi32(vEF_opn, vFa_ext);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm256_max_epi32(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
        }
    }

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}